

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O1

void __thiscall CEObserver::init_members(CEObserver *this)

{
  double dVar1;
  allocator<double> local_39;
  value_type_conflict local_38;
  vector<double,_std::allocator<double>_> local_30;
  
  this->longitude_ = 0.0;
  this->latitude_ = 0.0;
  this->elevation_m_ = 0.0;
  dVar1 = CppEphem::SeaLevelTemp_C();
  this->temperature_celsius_ = dVar1;
  dVar1 = CppEphem::EstimatePressure_hPa(this->elevation_m_);
  this->pressure_hPa_ = dVar1;
  *(undefined4 *)&this->relative_humidity_ = 0;
  *(undefined4 *)((long)&this->relative_humidity_ + 4) = 0;
  *(undefined4 *)&this->wavelength_um_ = 0;
  *(undefined4 *)((long)&this->wavelength_um_ + 4) = 0x3fe00000;
  dVar1 = CETime::SystemUTCOffset_hrs();
  this->utc_offset_ = dVar1;
  this->cache_date_ = -1e+30;
  local_38 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(&local_30,3,&local_38,&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->pos_cirs_,&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  local_38 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(&local_30,3,&local_38,&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->pos_icrs_,&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  local_38 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(&local_30,3,&local_38,&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->vel_cirs_,&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  local_38 = 0.0;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector(&local_30,3,&local_38,&local_39);
  std::vector<double,_std::allocator<double>_>::operator=(&this->vel_icrs_,&local_30);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_39);
  return;
}

Assistant:

void CEObserver::init_members(void)
{
    longitude_           = 0.0;
    latitude_            = 0.0;
    elevation_m_         = 0.0;
    temperature_celsius_ = CppEphem::SeaLevelTemp_C();
    pressure_hPa_        = CppEphem::EstimatePressure_hPa(elevation_m_);
    relative_humidity_   = 0.0;
    wavelength_um_       = 0.5;
    utc_offset_          = CETime::SystemUTCOffset_hrs();

    // cached pos/vel parameters
    cache_date_ = -1.0e30;
    pos_cirs_   = std::vector<double>(3, 0.0);
    pos_icrs_   = std::vector<double>(3, 0.0);
    vel_cirs_   = std::vector<double>(3, 0.0);
    vel_icrs_   = std::vector<double>(3, 0.0);
}